

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O2

int nn_shutdown(int s,int how)

{
  int iVar1;
  nn_sock *in_RAX;
  int *piVar2;
  nn_sock *sock;
  
  sock = in_RAX;
  iVar1 = nn_global_hold_socket(&sock,s);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    *piVar2 = -iVar1;
  }
  else {
    iVar1 = nn_sock_rm_ep(sock,how);
    if (-1 < iVar1) {
      if (iVar1 == 0) {
        nn_global_rele_socket(sock);
        return 0;
      }
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/core/global.c"
              ,0x29a);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_global_rele_socket(sock);
    piVar2 = __errno_location();
    *piVar2 = -iVar1;
  }
  return -1;
}

Assistant:

int nn_shutdown (int s, int how)
{
    int rc;
    struct nn_sock *sock;

    rc = nn_global_hold_socket (&sock, s);
    if (nn_slow (rc < 0)) {
        errno = -rc;
        return -1;
    }

    rc = nn_sock_rm_ep (sock, how);
    if (nn_slow (rc < 0)) {
        nn_global_rele_socket (sock);
        errno = -rc;
        return -1;
    }
    nn_assert (rc == 0);

    nn_global_rele_socket (sock);
    return 0;
}